

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointFrame.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLinkPointFrameGeneric::IntLoadConstraint_C
          (ChLinkPointFrameGeneric *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  element_type *peVar4;
  element_type *peVar5;
  double *pdVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined8 in_XMM1_Qb;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  ChQuaternion<double> q;
  ChMatrix33<double> Arw;
  ChQuaternion<double> local_98;
  ChMatrix33<double> local_78;
  
  uVar13 = (ulong)off_L;
  iVar12 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar12 != '\0') {
    peVar4 = (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
    dVar23 = (peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar23;
    dVar20 = (this->m_csys).rot.m_data[0];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar20;
    dVar15 = (this->m_csys).rot.m_data[1];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar15;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar15 * dVar23;
    auVar7 = vfmsub231sd_fma(auVar31,auVar16,auVar24);
    dVar15 = (peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
    auVar33._8_8_ = 0;
    auVar33._0_8_ = dVar15;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = (this->m_csys).rot.m_data[2];
    auVar7 = vfnmadd231sd_fma(auVar7,auVar33,auVar35);
    dVar1 = (peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar1;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = (this->m_csys).rot.m_data[3];
    auVar8 = vfnmadd231sd_fma(auVar7,auVar36,auVar37);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar20 * dVar23;
    auVar7 = vfmadd231sd_fma(auVar38,auVar16,auVar29);
    auVar7 = vfnmadd231sd_fma(auVar7,auVar36,auVar35);
    auVar7 = vfmadd231sd_fma(auVar7,auVar33,auVar37);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar20 * dVar15;
    auVar14 = vfmadd231sd_fma(auVar39,auVar16,auVar35);
    auVar14 = vfmadd231sd_fma(auVar14,auVar36,auVar29);
    auVar9 = vfnmadd231sd_fma(auVar14,auVar21,auVar37);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar20 * dVar1;
    auVar14 = vfmadd231sd_fma(auVar25,auVar16,auVar37);
    auVar14 = vfnmadd231sd_fma(auVar14,auVar33,auVar29);
    auVar14 = vfmadd231sd_fma(auVar14,auVar21,auVar35);
    local_98.m_data[0] = auVar8._0_8_;
    local_98.m_data[1] = auVar7._0_8_;
    local_98.m_data[2] = auVar9._0_8_;
    local_98.m_data[3] = auVar14._0_8_;
    ChMatrix33<double>::ChMatrix33(&local_78,&local_98);
    peVar5 = (this->m_node).
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar4 = (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    ChTransform<double>::TransformLocalToParent
              (&(this->m_csys).pos,
               &(peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
               &(peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
    dVar23 = *(double *)&(peVar5->super_ChNodeFEAbase).field_0x20 - local_98.m_data[0];
    dVar20 = *(double *)&peVar5->field_0x28 - local_98.m_data[1];
    dVar15 = *(double *)&peVar5->field_0x30 - local_98.m_data[2];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar23;
    auVar30._8_8_ = 0;
    auVar30._0_8_ =
         dVar20 * local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3];
    auVar7 = vfmadd231sd_fma(auVar30,auVar17,auVar7);
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar15;
    auVar7 = vfmadd231sd_fma(auVar7,auVar26,auVar14);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
    auVar32._8_8_ = 0;
    auVar32._0_8_ =
         dVar20 * local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar14 = vfmadd231sd_fma(auVar32,auVar17,auVar8);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[7];
    auVar14 = vfmadd231sd_fma(auVar14,auVar26,auVar9);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar23;
    auVar34._8_8_ = 0;
    auVar34._0_8_ =
         dVar20 * local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5];
    auVar8 = vfmadd231sd_fma(auVar34,auVar18,auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar15;
    auVar8 = vfmadd231sd_fma(auVar8,auVar27,auVar3);
    dVar23 = auVar7._0_8_ * c;
    dVar20 = auVar14._0_8_ * c;
    dVar15 = auVar8._0_8_ * c;
    if (do_clamp) {
      auVar11._8_8_ = in_XMM1_Qb;
      auVar11._0_8_ = recovery_clamp;
      auVar10._8_8_ = 0x8000000000000000;
      auVar10._0_8_ = 0x8000000000000000;
      auVar14 = vxorpd_avx512vl(auVar11,auVar10);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar23;
      auVar7 = vmaxsd_avx(auVar28,auVar14);
      auVar7 = vminsd_avx(auVar7,auVar11);
      dVar23 = auVar7._0_8_;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar20;
      auVar7 = vmaxsd_avx(auVar22,auVar14);
      auVar7 = vminsd_avx(auVar7,auVar11);
      dVar20 = auVar7._0_8_;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar15;
      auVar7 = vmaxsd_avx(auVar19,auVar14);
      auVar7 = vminsd_avx(auVar7,auVar11);
      dVar15 = auVar7._0_8_;
    }
    iVar12 = 0;
    if ((this->c_x == true) &&
       (iVar12 = 0, (this->constraint1).super_ChConstraintTwo.super_ChConstraint.active == true)) {
      if ((Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)uVar13) goto LAB_0062bf3c;
      pdVar6 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      pdVar6[uVar13] = dVar23 + pdVar6[uVar13];
      iVar12 = 1;
    }
    if ((this->c_y == true) &&
       ((this->constraint2).super_ChConstraintTwo.super_ChConstraint.active == true)) {
      uVar13 = (ulong)(iVar12 + off_L);
      if ((Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)uVar13) goto LAB_0062bf3c;
      pdVar6 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      pdVar6[uVar13] = dVar20 + pdVar6[uVar13];
      iVar12 = iVar12 + 1;
    }
    if ((this->c_z == true) &&
       ((this->constraint3).super_ChConstraintTwo.super_ChConstraint.active == true)) {
      uVar13 = (ulong)(iVar12 + off_L);
      if ((Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)uVar13) {
LAB_0062bf3c:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      pdVar6 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      pdVar6[uVar13] = dVar15 + pdVar6[uVar13];
    }
  }
  return;
}

Assistant:

void ChLinkPointFrameGeneric::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                                  ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                                  const double c,            // a scaling factor
                                                  bool do_clamp,             // apply clamping to c*C?
                                                  double recovery_clamp      // value for min/max clamping of c*C
) {
    if (!IsActive())
        return;

    ChMatrix33<> Arw(m_csys.rot >> m_body->GetRot());

    ChVector<> res = Arw.transpose() * (m_node->GetPos() - m_body->TransformPointLocalToParent(m_csys.pos));
    ChVector<> cres = res * c;

    if (do_clamp) {
        cres.x() = ChMin(ChMax(cres.x(), -recovery_clamp), recovery_clamp);
        cres.y() = ChMin(ChMax(cres.y(), -recovery_clamp), recovery_clamp);
        cres.z() = ChMin(ChMax(cres.z(), -recovery_clamp), recovery_clamp);
    }

    int cnt = 0;
    if (c_x && this->constraint1.IsActive()) {
        Qc(off_L + cnt) += cres.x();
        cnt++;
    }
    if (c_y && this->constraint2.IsActive()) {
        Qc(off_L + cnt) += cres.y();
        cnt++;
    }
    if (c_z && this->constraint3.IsActive()) {
        Qc(off_L + cnt) += cres.z();
        // cnt++;
    }
}